

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

QueryObject * anon_unknown.dwarf_182b7::getQueryObj(HelicsQuery query,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if ((query != (HelicsQuery)0x0) && (*(int *)((long)query + 0x7c) == 0x27063885)) {
      return (QueryObject *)query;
    }
  }
  else if (err->error_code == 0) {
    if ((query != (HelicsQuery)0x0) && (*(int *)((long)query + 0x7c) == 0x27063885)) {
      return (QueryObject *)query;
    }
    err->error_code = -3;
    err->message = "Query object is invalid";
  }
  return (QueryObject *)0x0;
}

Assistant:

helics::QueryObject* getQueryObj(HelicsQuery query, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (query == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidQueryString);
        return nullptr;
    }
    auto* queryPtr = reinterpret_cast<helics::QueryObject*>(query);
    if (queryPtr->valid != validQueryIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidQueryString);
        return nullptr;
    }
    return queryPtr;
}